

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.hpp
# Opt level: O0

task_handle __thiscall
oqpi::scheduler<concurrent_queue>::waitForNextTask(scheduler<concurrent_queue> *this,worker_base *w)

{
  bool bVar1;
  uint uVar2;
  worker_base *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  task_handle tVar3;
  undefined1 local_30 [8];
  anon_class_16_2_fd512de4 pumpTask;
  worker_base *w_local;
  scheduler<concurrent_queue> *this_local;
  task_handle *hTask;
  
  local_30 = (undefined1  [8])w;
  pumpTask.w = in_RDX;
  do {
    uVar2 = (*(pumpTask.w)->_vptr_worker_base[6])();
  } while ((uVar2 & 1) != 0);
  task_handle::task_handle((task_handle *)this);
  while (bVar1 = waitForNextTask::anon_class_16_2_fd512de4::operator()
                           ((anon_class_16_2_fd512de4 *)local_30,(task_handle *)this),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    (*(pumpTask.w)->_vptr_worker_base[5])();
    do {
      uVar2 = (*(pumpTask.w)->_vptr_worker_base[6])();
    } while ((uVar2 & 1) != 0);
  }
  tVar3.spTask_.super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  tVar3.spTask_.super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (task_handle)tVar3.spTask_.super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

task_handle waitForNextTask(worker_base &w)
        {
            const auto pumpTask = [this, &w](task_handle &hTask)
            {
                if (!running_.load())
                {
                    return true;
                }

                for (auto prio = 0; prio < PRIO_COUNT; ++prio)
                {
                    if (w.canWorkOnPriority(task_priority(prio)))
                    {
                        while (pendingTasks_[prio].tryPop(hTask))
                        {
                            // We got a task, try to grab it to ensure that we can work on it
                            // Note that a task_group can be done without being grabbed when calling activeWait
                            if (hTask.tryGrab() && !hTask.isDone())
                            {
                                // We got the go to start working on the current task
                                return true;
                            }
                            else
                            {
                                // The task has already been grabbed by someone else
                                hTask.reset();
                            }
                        }
                    }
                }

                return false;
            };

            // Before checking if we have a task decrement the semaphore count until it reaches 0
            while (w.tryWait());

            task_handle hTask;
            while (!pumpTask(hTask))
            {
                w.wait();
                while (w.tryWait());
            }

            return hTask;
        }